

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O3

void __thiscall TokenScanner::TokenScanner(TokenScanner *this,istream *infile)

{
  this->_vptr_TokenScanner = (_func_int **)&PTR__TokenScanner_00110aa8;
  (this->buffer)._M_dataplus._M_p = (pointer)&(this->buffer).field_2;
  (this->buffer)._M_string_length = 0;
  (this->buffer).field_2._M_local_buf[0] = '\0';
  (this->wordChars)._M_dataplus._M_p = (pointer)&(this->wordChars).field_2;
  (this->wordChars)._M_string_length = 0;
  (this->wordChars).field_2._M_local_buf[0] = '\0';
  this->ignoreWhitespaceFlag = false;
  this->ignoreCommentsFlag = false;
  this->scanNumbersFlag = false;
  this->scanStringsFlag = false;
  this->stringInputFlag = false;
  this->isp = infile;
  this->savedTokens = (StringCell *)0x0;
  this->operators = (StringCell *)0x0;
  return;
}

Assistant:

TokenScanner::TokenScanner(istream & infile) {
   initScanner();
   setInput(infile);
}